

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>::
     Operation<duckdb::timestamp_t,double,duckdb::ArgMinMaxState<duckdb::timestamp_t,double>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (ArgMinMaxState<duckdb::timestamp_t,_double> *state,timestamp_t *x,double *y,
               AggregateBinaryInput *binary)

{
  ArgMinMaxState<duckdb::timestamp_t,_double> *in_RDX;
  TemplatedValidityMask<unsigned_long> *in_RSI;
  double *in_RDI;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  double in_stack_ffffffffffffffc0;
  double *y_00;
  ArgMinMaxState<duckdb::timestamp_t,_double> *in_stack_ffffffffffffffc8;
  timestamp_t in_stack_ffffffffffffffd0;
  
  if (((ulong)*in_RDI & 1) == 0) {
    y_00 = in_RDI;
    TemplatedValidityMask<unsigned_long>::RowIsValid(in_RSI,(idx_t)in_RDI);
    Assign<duckdb::timestamp_t,double,duckdb::ArgMinMaxState<duckdb::timestamp_t,double>>
              (in_RDX,(timestamp_t *)in_RSI,y_00,(bool)in_stack_ffffffffffffffbf);
    *(byte *)in_RDI = 1;
  }
  else {
    Execute<duckdb::timestamp_t,double,duckdb::ArgMinMaxState<duckdb::timestamp_t,double>>
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc0,
               (AggregateBinaryInput *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8)
              );
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}